

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O1

void __thiscall
pbrt::OrthographicCamera::OrthographicCamera
          (OrthographicCamera *this,CameraBaseParameters *baseParameters,Bounds2f *screenWindow,
          Float lensRadius,Float focalDistance)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Transform local_3f0;
  CameraBaseParameters local_370;
  
  memcpy(&local_370,baseParameters,0x340);
  local_370.film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)
       (baseParameters->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  local_370.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(baseParameters->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  Orthographic(&local_3f0,0.0,1.0);
  ProjectiveCamera::ProjectiveCamera
            (&this->super_ProjectiveCamera,&local_370,&local_3f0,screenWindow,lensRadius,
             focalDistance);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  auVar7 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][1]);
  auVar10 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][1]);
  auVar4 = vinsertps_avx(auVar7,auVar10,0x10);
  auVar6 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][0]);
  auVar9 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0]);
  auVar5 = vinsertps_avx(auVar6,auVar9,0x10);
  auVar12._0_4_ = auVar5._0_4_ + auVar4._0_4_ * 0.0;
  auVar12._4_4_ = auVar5._4_4_ + auVar4._4_4_ * 0.0;
  auVar12._8_4_ = auVar5._8_4_ + auVar4._8_4_ * 0.0;
  auVar12._12_4_ = auVar5._12_4_ + auVar4._12_4_ * 0.0;
  auVar8 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][2]);
  auVar11 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2]);
  auVar4 = vinsertps_avx(auVar8,auVar11,0x10);
  auVar4 = vfmadd213ps_fma(auVar4,ZEXT816(0) << 0x40,auVar12);
  fVar1 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][0];
  fVar2 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][1];
  auVar13 = ZEXT816(0) << 0x40;
  auVar12 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2]);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * 0.0 + fVar1)),auVar12,auVar13);
  uVar3 = vmovlps_avx(auVar4);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z = auVar5._0_4_;
  auVar4 = vfmadd213ss_fma(auVar6,auVar13,auVar7);
  auVar5 = vfmadd231ss_fma(auVar4,auVar13,auVar8);
  auVar4 = vfmadd213ss_fma(auVar9,auVar13,auVar10);
  auVar4 = vfmadd231ss_fma(auVar4,auVar13,auVar11);
  auVar4 = vinsertps_avx(auVar5,auVar4,0x10);
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar13,ZEXT416((uint)fVar2));
  auVar5 = vfmadd231ss_fma(auVar5,auVar12,ZEXT816(0));
  uVar3 = vmovlps_avx(auVar4);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z = auVar5._0_4_;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  fVar1 = (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
          super_Tuple3<pbrt::Vector3,_float>.y;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.x =
       (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
       super_Tuple3<pbrt::Vector3,_float>.x;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.y = fVar1;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.z =
       (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
       super_Tuple3<pbrt::Vector3,_float>.z;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.z = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar1 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.x = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.y = fVar1;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.z = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar1 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.x = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.y = fVar1;
  return;
}

Assistant:

OrthographicCamera(CameraBaseParameters baseParameters, const Bounds2f &screenWindow,
                       Float lensRadius, Float focalDistance)
        : ProjectiveCamera(baseParameters, Orthographic(0, 1), screenWindow, lensRadius,
                           focalDistance) {
        // Compute differential changes in origin for orthographic camera rays
        dxCamera = cameraFromRaster(Vector3f(1, 0, 0));
        dyCamera = cameraFromRaster(Vector3f(0, 1, 0));

        // Compute minimum differentials for orthographic camera
        minDirDifferentialX = minDirDifferentialY = Vector3f(0, 0, 0);
        minPosDifferentialX = dxCamera;
        minPosDifferentialY = dyCamera;
    }